

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ParseLibraryDeclaration(Parser *this)

{
  bool bVar1;
  undefined1 local_60 [32];
  String libraryName;
  
  if ((this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    Error<>(this,"Library has already been declared for this script");
    return;
  }
  libraryName._M_dataplus._M_p = (pointer)&libraryName.field_2;
  libraryName._M_string_length = 0;
  libraryName.field_2._M_local_buf[0] = '\0';
  bVar1 = Accept(this,Library);
  if (bVar1) {
    ParseName_abi_cxx11_((String *)local_60,this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (&libraryName,
               (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_60);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_60);
    if (libraryName._M_string_length == 0) {
      Error<>(this,"Expected valid name after \'library\' keyword");
      goto LAB_00121171;
    }
    Expect(this,NewLine,(char *)0x0);
    Runtime::GetLibraryInternal
              ((Runtime *)local_60,
               (String *)
               (this->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_library).
                super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  }
  EmitOpcode(this,Library);
  BinaryWriter::Write(&this->m_writer,&libraryName);
  Runtime::GetLibraryInternal
            ((Runtime *)local_60,
             (String *)
             (this->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
LAB_00121171:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&libraryName);
  return;
}

Assistant:

inline_t void Parser::ParseLibraryDeclaration()
	{
		if (m_library != nullptr)
		{
			Error("Library has already been declared for this script");
			return;
		}
		String libraryName;
		if (Accept(SymbolType::Library))
		{
			libraryName = ParseName();
			if (libraryName.empty())
			{
				Error("Expected valid name after 'library' keyword");
				return;
			}
			Expect(SymbolType::NewLine);
			m_library = m_runtime->GetLibraryInternal(libraryName);
		}

		// Emit library declaration bytecode
		EmitOpcode(Opcode::Library);
		EmitName(libraryName);

		// Retrieve library interface by name
		m_library = m_runtime->GetLibraryInternal(libraryName);
	}